

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exports.cpp
# Opt level: O1

void io::export_map_connections_as_json(World *world,string *file_path)

{
  pointer pMVar1;
  pointer pMVar2;
  Json map_connections_json;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  bStack_48;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&bStack_48,(initializer_list_t)ZEXT816(0),false,array);
  pMVar2 = (world->_map_connections).
           super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (world->_map_connections).
           super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar2 != pMVar1) {
    do {
      MapConnection::to_json_abi_cxx11_((MapConnection *)&local_38);
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::
      emplace_back<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&bStack_48,&local_38);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_38);
      pMVar2 = pMVar2 + 1;
    } while (pMVar2 != pMVar1);
  }
  dump_json_to_file(&bStack_48,file_path);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&bStack_48);
  return;
}

Assistant:

void io::export_map_connections_as_json(const World& world, const std::string& file_path)
{
    Json map_connections_json = Json::array();
    for(const MapConnection& connection : world.map_connections())
        map_connections_json.emplace_back(connection.to_json());
    dump_json_to_file(map_connections_json, file_path);
}